

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int anon_unknown.dwarf_8f1b29::MapVersionToIndex(int version)

{
  uint local_10;
  int index;
  int version_local;
  
  if (version == 100) {
    local_10 = 0;
  }
  else if (version == 0x6e) {
    local_10 = 1;
  }
  else if (version == 0x78) {
    local_10 = 2;
  }
  else if (version == 0x82) {
    local_10 = 3;
  }
  else if (version == 0x8c) {
    local_10 = 4;
  }
  else if (version == 0x96) {
    local_10 = 5;
  }
  else if (version == 300) {
    local_10 = 6;
  }
  else if (version == 0x136) {
    local_10 = 0xd;
  }
  else if (version == 0x140) {
    local_10 = 0xf;
  }
  else if (version == 0x14a) {
    local_10 = 7;
  }
  else if (version == 400) {
    local_10 = 8;
  }
  else if (version == 0x19a) {
    local_10 = 9;
  }
  else if (version == 0x1a4) {
    local_10 = 10;
  }
  else if (version == 0x1ae) {
    local_10 = 0xb;
  }
  else if (version == 0x1b8) {
    local_10 = 0xc;
  }
  else if (version == 0x1c2) {
    local_10 = 0xe;
  }
  else if (version == 0x1cc) {
    local_10 = 0x10;
  }
  else {
    if (version != 500) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                    ,0xa0,"int (anonymous namespace)::MapVersionToIndex(int)");
    }
    local_10 = 0;
  }
  if (local_10 < 0x11) {
    return local_10;
  }
  __assert_fail("index < VersionCount",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                ,0xa3,"int (anonymous namespace)::MapVersionToIndex(int)");
}

Assistant:

int MapVersionToIndex(int version)
{
    int index = 0;

    switch (version) {
    case 100: index =  0; break;
    case 110: index =  1; break;
    case 120: index =  2; break;
    case 130: index =  3; break;
    case 140: index =  4; break;
    case 150: index =  5; break;
    case 300: index =  6; break;
    case 330: index =  7; break;
    case 400: index =  8; break;
    case 410: index =  9; break;
    case 420: index = 10; break;
    case 430: index = 11; break;
    case 440: index = 12; break;
    case 310: index = 13; break;
    case 450: index = 14; break;
    case 500: index =  0; break; // HLSL
    case 320: index = 15; break;
    case 460: index = 16; break;
    default:  assert(0);  break;
    }

    assert(index < VersionCount);

    return index;
}